

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint_mant.c
# Opt level: O0

int main(void)

{
  undefined1 local_c0 [8];
  _PDCLIB_bigint_t bigint;
  uchar mant [33];
  
  memset(&bigint.size,0x33,0x21);
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,1);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x4a,"bigint.size == 1");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x4b,"bigint.data[ bigint.size - 1 ] == 0x01");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,2);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x4e,"bigint.size == 1");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x4f,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,3);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x52,"bigint.size == 1");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x53,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,4);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x56,"bigint.size == 1");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x57,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,5);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x5a,"bigint.size == 1");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 0x13) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x5b,"bigint.data[ bigint.size - 1 ] == 0x13");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,6);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x5e,"bigint.size == 1");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x5f,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,7);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x62,"bigint.size == 1");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,99,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,8);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x66,"bigint.size == 1");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x67,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x10);
  if (bigint.data._120_8_ != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x6a,"bigint.size == 1");
  }
  if ((int)(uint)bigint.data[bigint.data._120_8_ + -5] >> 8 != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x6b,
           "bigint.data[ bigint.size - 1 ] >> ( _PDCLIB_BIGINT_DIGIT_BITS - _PDCLIB_CHAR_BIT ) == 0x33"
          );
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x11);
  if (bigint.data._120_8_ != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x6e,"bigint.size == 2");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x6f,"bigint.data[ bigint.size - 1 ] == 0x01");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x12);
  if (bigint.data._120_8_ != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x72,"bigint.size == 2");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x73,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x13);
  if (bigint.data._120_8_ != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x76,"bigint.size == 2");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x77,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x14);
  if (bigint.data._120_8_ != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x7a,"bigint.size == 2");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x7b,"bigint.data[ bigint.size - 1 ] == 0x03");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x15);
  if (bigint.data._120_8_ != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x7e,"bigint.size == 2");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 0x13) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x7f,"bigint.data[ bigint.size - 1 ] == 0x13");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x16);
  if (bigint.data._120_8_ != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x82,"bigint.size == 2");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x83,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x17);
  if (bigint.data._120_8_ != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x86,"bigint.size == 2");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x87,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  _PDCLIB_bigint_mant((_PDCLIB_bigint_t *)local_c0,mant + 8,0x18);
  if (bigint.data._120_8_ != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x8a,"bigint.size == 2");
  }
  if (bigint.data[bigint.data._120_8_ + -5] != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_mant.c, line %d - %s\n"
           ,0x8b,"bigint.data[ bigint.size - 1 ] == 0x33");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    unsigned char mant[] = {
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33, 0x33,
        0x33
    };
    _PDCLIB_bigint_t bigint;

    _PDCLIB_bigint_mant( &bigint, mant + 16, 1 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x01 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 2 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 3 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 4 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 5 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x13 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 6 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 7 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, 8 );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS );
    TESTCASE( bigint.size == 1 );
    TESTCASE( bigint.data[ bigint.size - 1 ] >> ( _PDCLIB_BIGINT_DIGIT_BITS - _PDCLIB_CHAR_BIT ) == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 1 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x01 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 2 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 3 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 4 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x03 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 5 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x13 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 6 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 7 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );

    _PDCLIB_bigint_mant( &bigint, mant + 16, _PDCLIB_BIGINT_DIGIT_BITS + 8 );
    TESTCASE( bigint.size == 2 );
    TESTCASE( bigint.data[ bigint.size - 1 ] == 0x33 );
#endif

    return TEST_RESULTS;
}